

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

void __thiscall wabt::LocalTypes::Set(LocalTypes *this,TypeVector *types)

{
  pointer ppVar1;
  pointer pTVar2;
  pointer pTVar3;
  Type TVar4;
  uint uVar5;
  ulong uVar6;
  Type type;
  uint local_3c;
  Type local_38;
  
  ppVar1 = (this->decls_).
           super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->decls_).
      super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar1) {
    (this->decls_).
    super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar1;
  }
  pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar3 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar2 != pTVar3) {
    TVar4 = *pTVar2;
    local_3c = 1;
    local_38 = TVar4;
    if (8 < (ulong)((long)pTVar3 - (long)pTVar2)) {
      uVar6 = 1;
      uVar5 = 2;
      do {
        if (pTVar2[uVar6] == TVar4) {
          local_3c = local_3c + 1;
        }
        else {
          std::
          vector<std::pair<wabt::Type,unsigned_int>,std::allocator<std::pair<wabt::Type,unsigned_int>>>
          ::emplace_back<wabt::Type&,unsigned_int&>
                    ((vector<std::pair<wabt::Type,unsigned_int>,std::allocator<std::pair<wabt::Type,unsigned_int>>>
                      *)this,&local_38,&local_3c);
          pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          TVar4 = pTVar2[uVar6];
          pTVar3 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          local_3c = 1;
          local_38 = TVar4;
        }
        uVar6 = (ulong)uVar5;
        uVar5 = uVar5 + 1;
      } while (uVar6 < (ulong)((long)pTVar3 - (long)pTVar2 >> 3));
    }
    std::
    vector<std::pair<wabt::Type,unsigned_int>,std::allocator<std::pair<wabt::Type,unsigned_int>>>::
    emplace_back<wabt::Type&,unsigned_int&>
              ((vector<std::pair<wabt::Type,unsigned_int>,std::allocator<std::pair<wabt::Type,unsigned_int>>>
                *)this,&local_38,&local_3c);
  }
  return;
}

Assistant:

void LocalTypes::Set(const TypeVector& types) {
  decls_.clear();
  if (types.empty()) {
    return;
  }

  Type type = types[0];
  Index count = 1;
  for (Index i = 1; i < types.size(); ++i) {
    if (types[i] != type) {
      decls_.emplace_back(type, count);
      type = types[i];
      count = 1;
    } else {
      ++count;
    }
  }
  decls_.emplace_back(type, count);
}